

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall
TimerManager::addTimer(TimerManager *this,shared_ptr<HttpData> *SPHttpData,int timeout)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<HttpData> local_48;
  undefined1 local_38 [8];
  SPTimerNode new_node;
  
  local_38 = (undefined1  [8])operator_new(0x20);
  local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (SPHttpData->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (SPHttpData->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  TimerNode::TimerNode((TimerNode *)local_38,&local_48,timeout);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<TimerNode*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_node,(TimerNode *)local_38);
  if (local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::
  priority_queue<std::shared_ptr<TimerNode>,_std::deque<std::shared_ptr<TimerNode>,_std::allocator<std::shared_ptr<TimerNode>_>_>,_TimerCmp>
  ::push(&this->timerNodeQueue,(value_type *)local_38);
  peVar1 = (SPHttpData->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               expiredTime_ =
           (int)(new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                expiredTime_ + 1;
      UNLOCK();
    }
    else {
      *(int *)&(new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               expiredTime_ =
           (int)(new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                expiredTime_ + 1;
    }
  }
  (peVar1->timer_).super___weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->timer_).super___weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_50);
  if ((element_type *)local_50._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  if (new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void TimerManager::addTimer(std::shared_ptr<HttpData> SPHttpData, int timeout) {
  SPTimerNode new_node(new TimerNode(SPHttpData, timeout));
  timerNodeQueue.push(new_node);
  SPHttpData->linkTimer(new_node);
}